

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O3

tiles_t * read_tiles(tiles_t *__return_storage_ptr__,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *tokens)

{
  int iVar1;
  ulong uVar2;
  _Alloc_hider __nptr;
  long lVar3;
  mapped_type *__dest;
  int *piVar4;
  ulonglong uVar5;
  invalid_argument *this;
  int iVar6;
  ulong uVar7;
  pointer this_00;
  char *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [11];
  generic_tile_t<10UL> local_190;
  
  *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (tokens->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar6 = 0;
  memset(&local_190,0,0x15c);
  if (this_00 !=
      (tokens->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      while( true ) {
        uVar2 = this_00->_M_string_length;
        if (uVar2 == 0) break;
        piVar4 = (int *)(this_00->_M_dataplus)._M_p;
        if (uVar2 < 5) {
LAB_00102731:
          uVar7 = 0;
          do {
            local_190.data._M_elems[iVar6]._M_elems[uVar7] = *(char *)((long)piVar4 + uVar7);
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
LAB_00102755:
          iVar6 = iVar6 + 1;
        }
        else {
          if ((char)piVar4[1] != ' ' || *piVar4 != 0x656c6954) {
            if (0 < (long)uVar2) goto LAB_00102731;
            goto LAB_00102755;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (local_2f0,this_00,5,uVar2 - 6);
          __nptr._M_p = local_2f0[0]._M_dataplus._M_p;
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          *piVar4 = 0;
          uVar5 = strtoull(__nptr._M_p,&local_2f8,10);
          if (local_2f8 == __nptr._M_p) {
            std::__throw_invalid_argument("stoull");
LAB_00102984:
            std::__throw_out_of_range("stoull");
            goto LAB_00102990;
          }
          if (*piVar4 == 0) {
            *piVar4 = iVar1;
          }
          else if (*piVar4 == 0x22) goto LAB_00102984;
          local_190.id = uVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0[0]._M_dataplus._M_p != &local_2f0[0].field_2) {
            operator_delete(local_2f0[0]._M_dataplus._M_p,
                            local_2f0[0].field_2._M_allocated_capacity + 1);
          }
        }
        this_00 = this_00 + 1;
        if (this_00 ==
            (tokens->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          if (iVar6 == 0) {
            return __return_storage_ptr__;
          }
LAB_00102990:
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this,"Unprocessed data, did you end with an empty line?");
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
      }
      if (iVar6 == 10) {
        generic_tile_t<10UL>::make_edges((edges_t *)local_2f0,&local_190);
        memcpy(&local_190.edges,local_2f0,0x50);
        generic_tile_t<10UL>::make_corners((corners_t *)local_2f0,&local_190);
        lVar3 = 0;
        do {
          *(undefined2 *)(local_190.corners._M_elems[0].first._M_elems + lVar3 + 8) =
               *(undefined2 *)((long)&local_2f0[0]._M_string_length + lVar3);
          *(undefined8 *)(local_190.corners._M_elems[0].first._M_elems + lVar3) =
               *(undefined8 *)((long)&local_2f0[0]._M_dataplus._M_p + lVar3);
          *(undefined8 *)(local_190.corners._M_elems[0].second._M_elems + lVar3) =
               *(undefined8 *)((long)&local_2f0[0]._M_string_length + lVar3 + 2);
          *(undefined2 *)(local_190.corners._M_elems[0].second._M_elems + lVar3 + 8) =
               *(undefined2 *)((long)&local_2f0[0].field_2 + lVar3 + 2);
          lVar3 = lVar3 + 0x14;
        } while (lVar3 != 0xa0);
        __dest = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)__return_storage_ptr__,&local_190.id);
        memcpy(__dest,&local_190,0xbc);
        lVar3 = 0;
        do {
          *(undefined2 *)((__dest->corners)._M_elems[0].first._M_elems + lVar3 + 8) =
               *(undefined2 *)(local_190.corners._M_elems[0].first._M_elems + lVar3 + 8);
          *(undefined8 *)((__dest->corners)._M_elems[0].first._M_elems + lVar3) =
               *(undefined8 *)(local_190.corners._M_elems[0].first._M_elems + lVar3);
          *(undefined8 *)((__dest->corners)._M_elems[0].second._M_elems + lVar3) =
               *(undefined8 *)(local_190.corners._M_elems[0].second._M_elems + lVar3);
          *(undefined2 *)((__dest->corners)._M_elems[0].second._M_elems + lVar3 + 8) =
               *(undefined2 *)(local_190.corners._M_elems[0].second._M_elems + lVar3 + 8);
          lVar3 = lVar3 + 0x14;
        } while (lVar3 != 0xa0);
      }
      memset(local_2f0,0,0x15c);
      lVar3 = 0xbc;
      memset(&local_190,0,0xbc);
      do {
        *(undefined2 *)(local_190.data._M_elems[0]._M_elems + lVar3) =
             *(undefined2 *)((long)&local_2f0[0]._M_string_length + lVar3);
        *(undefined8 *)(local_190.data._M_elems[0]._M_elems + lVar3 + -8) =
             *(undefined8 *)((long)&local_2f0[0]._M_dataplus._M_p + lVar3);
        *(undefined8 *)(local_190.data._M_elems[0]._M_elems + lVar3 + 2) =
             *(undefined8 *)((long)&local_2f0[0]._M_string_length + lVar3 + 2);
        *(undefined2 *)(local_190.data._M_elems[1]._M_elems + lVar3) =
             *(undefined2 *)((long)&local_2f0[0].field_2 + lVar3 + 2);
        lVar3 = lVar3 + 0x14;
      } while (lVar3 != 0x15c);
      this_00 = this_00 + 1;
      iVar6 = 0;
    } while (this_00 !=
             (tokens->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

tiles_t read_tiles(const std::vector<std::string>& tokens) {
  auto tiles = tiles_t {};

  auto it = tokens.cbegin();
  auto tile = tile_t {};
  static constexpr auto id_prefix = std::string_view {"Tile "};
  auto row = 0;
  while (it != tokens.cend()) {
    if (it->empty()) { // make sure to end with an empty line
      if (row == 10) {
        tile.edges = tile.make_edges();
        tile.corners = tile.make_corners();
        tiles[tile.id] = tile;
      }
      row = 0;
      tile = {};
    } else if (it->starts_with(id_prefix)) {
      tile.id = std::stoull(it->substr(id_prefix.size(), it->size() - id_prefix.size()-1));
    } else {
      ranges::copy(*it, tile.data[row++].begin());
    }

    it++;
  }
  if (row != 0) {
    throw std::invalid_argument("Unprocessed data, did you end with an empty line?");
  }

  return tiles;
}